

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void RVO::linearProgram4(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,size_t numObstacles
                        ,size_t beginPlane,float radius,Vector3 *result)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  Vector3 local_13c;
  undefined1 local_130 [8];
  Vector3 tempResult;
  RVO local_118 [12];
  Vector3 local_10c;
  RVO local_100 [12];
  Vector3 local_f4;
  undefined1 local_e8 [8];
  Vector3 lineNormal;
  RVO local_d0 [12];
  undefined1 local_c4 [8];
  Vector3 crossProduct;
  Plane plane;
  size_t j;
  allocator<RVO::Plane> local_81;
  __normal_iterator<const_RVO::Plane_*,_std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>_>
  local_80;
  __normal_iterator<const_RVO::Plane_*,_std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>_>
  local_78;
  __normal_iterator<const_RVO::Plane_*,_std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>_>
  local_70;
  undefined1 local_68 [8];
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> projPlanes;
  ulong local_40;
  size_t i;
  float distance;
  Vector3 *result_local;
  float radius_local;
  size_t beginPlane_local;
  size_t numObstacles_local;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes_local;
  
  i._4_4_ = 0.0;
  local_40 = beginPlane;
  do {
    sVar1 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::size(planes);
    if (sVar1 <= local_40) {
      return;
    }
    pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
    pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
    Vector3::operator-((Vector3 *)
                       ((long)&projPlanes.
                               super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4),&pvVar3->point);
    fVar5 = Vector3::operator*(&pvVar2->normal,
                               (Vector3 *)
                               ((long)&projPlanes.
                                       super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    if (i._4_4_ < fVar5) {
      local_70._M_current =
           (Plane *)std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::begin(planes);
      local_80._M_current =
           (Plane *)std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::begin(planes);
      local_78 = __gnu_cxx::
                 __normal_iterator<const_RVO::Plane_*,_std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>_>
                 ::operator+(&local_80,numObstacles);
      std::allocator<RVO::Plane>::allocator(&local_81);
      std::vector<RVO::Plane,std::allocator<RVO::Plane>>::
      vector<__gnu_cxx::__normal_iterator<RVO::Plane_const*,std::vector<RVO::Plane,std::allocator<RVO::Plane>>>,void>
                ((vector<RVO::Plane,std::allocator<RVO::Plane>> *)local_68,local_70,local_78,
                 &local_81);
      std::allocator<RVO::Plane>::~allocator(&local_81);
      for (plane.normal.val_._4_8_ = numObstacles; (ulong)plane.normal.val_._4_8_ < local_40;
          plane.normal.val_._4_8_ = plane.normal.val_._4_8_ + 1) {
        Plane::Plane((Plane *)(crossProduct.val_ + 1));
        pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                           (planes,plane.normal.val_._4_8_);
        pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
        cross((RVO *)local_c4,&pvVar2->normal,&pvVar3->normal);
        fVar5 = absSq((Vector3 *)local_c4);
        if (1e-05 < fVar5) {
          pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40)
          ;
          cross((RVO *)local_e8,(Vector3 *)local_c4,&pvVar2->normal);
          pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40)
          ;
          pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                             (planes,plane.normal.val_._4_8_);
          std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
          Vector3::operator-(&local_10c,&pvVar3->point);
          pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                             (planes,plane.normal.val_._4_8_);
          fVar5 = Vector3::operator*(&local_10c,&pvVar3->normal);
          pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                             (planes,plane.normal.val_._4_8_);
          fVar6 = Vector3::operator*((Vector3 *)local_e8,&pvVar3->normal);
          operator*(local_100,fVar5 / fVar6,(Vector3 *)local_e8);
          Vector3::operator+(&local_f4,&pvVar2->point);
          crossProduct.val_[1] = local_f4.val_[0];
          crossProduct.val_[2] = local_f4.val_[1];
LAB_00113c65:
          pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                             (planes,plane.normal.val_._4_8_);
          std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
          Vector3::operator-((Vector3 *)(tempResult.val_ + 1),&pvVar2->normal);
          normalize(local_118,(Vector3 *)(tempResult.val_ + 1));
          std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::push_back
                    ((vector<RVO::Plane,_std::allocator<RVO::Plane>_> *)local_68,
                     (value_type *)(crossProduct.val_ + 1));
        }
        else {
          pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40)
          ;
          pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                             (planes,plane.normal.val_._4_8_);
          fVar5 = Vector3::operator*(&pvVar2->normal,&pvVar3->normal);
          if (fVar5 <= 0.0) {
            pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                               (planes,local_40);
            std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[]
                      (planes,plane.normal.val_._4_8_);
            Vector3::operator+((Vector3 *)(lineNormal.val_ + 1),&pvVar2->point);
            operator*(local_d0,0.5,(Vector3 *)(lineNormal.val_ + 1));
            crossProduct.val_._4_8_ = local_d0._0_8_;
            goto LAB_00113c65;
          }
        }
      }
      Vector3::Vector3((Vector3 *)local_130,result);
      pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
      sVar4 = linearProgram3((vector<RVO::Plane,_std::allocator<RVO::Plane>_> *)local_68,radius,
                             &pvVar2->normal,true,result);
      sVar1 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::size
                        ((vector<RVO::Plane,_std::allocator<RVO::Plane>_> *)local_68);
      if (sVar4 < sVar1) {
        *(undefined1 (*) [8])result->val_ = local_130;
        result->val_[2] = tempResult.val_[0];
      }
      pvVar2 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
      pvVar3 = std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::operator[](planes,local_40);
      Vector3::operator-(&local_13c,&pvVar3->point);
      i._4_4_ = Vector3::operator*(&pvVar2->normal,&local_13c);
      std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::~vector
                ((vector<RVO::Plane,_std::allocator<RVO::Plane>_> *)local_68);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void linearProgram4(const std::vector<Plane> &planes, size_t numObstacles, size_t beginPlane, float radius, Vector3 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginPlane; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > distance) {
				/* Result does not satisfy constraint of plane i. */
				std::vector<Plane> projPlanes(planes.begin(), planes.begin() + static_cast<ptrdiff_t>(numObstacles));

				for (size_t j = numObstacles; j < i; ++j) {
					Plane plane;

					const Vector3 crossProduct = cross(planes[j].normal, planes[i].normal);

					if (absSq(crossProduct) <= RVO_EPSILON) {
						/* Plane i and plane j are (almost) parallel. */
						if (planes[i].normal * planes[j].normal > 0.0f) {
							/* Plane i and plane j point in the same direction. */
							continue;
						}
						else {
							/* Plane i and plane j point in opposite direction. */
							plane.point = 0.5f * (planes[i].point + planes[j].point);
						}
					}
					else {
						/* Plane.point is point on line of intersection between plane i and plane j. */
						const Vector3 lineNormal = cross(crossProduct, planes[i].normal);
						plane.point = planes[i].point + (((planes[j].point - planes[i].point) * planes[j].normal) / (lineNormal * planes[j].normal)) * lineNormal;
					}

					plane.normal = normalize(planes[j].normal - planes[i].normal);
					projPlanes.push_back(plane);
				}

				const Vector3 tempResult = result;

				if (linearProgram3(projPlanes, radius, planes[i].normal, true, result) < projPlanes.size()) {
					/* This should in principle not happen.  The result is by definition already in the feasible region of this linear program. If it fails, it is due to small floating point error, and the current result is kept. */
					result = tempResult;
				}

				distance = planes[i].normal * (planes[i].point - result);
			}
		}
	}